

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.cpp
# Opt level: O2

bool __thiscall OpenMD::SectionParser::isEndSection(SectionParser *this,string *line)

{
  bool bVar1;
  __type_conflict _Var2;
  int iVar3;
  string keyword;
  string section;
  StringTokenizer tokenizer;
  string sStack_a8;
  string local_88;
  StringTokenizer local_68;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_a8," ;\t\n\r",(allocator<char> *)&local_88);
  StringTokenizer::StringTokenizer(&local_68,line,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  iVar3 = StringTokenizer::countTokens(&local_68);
  if (iVar3 < 2) {
    _Var2 = false;
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&sStack_a8,&local_68);
    bVar1 = std::operator!=(&sStack_a8,"end");
    if (bVar1) {
      _Var2 = false;
    }
    else {
      StringTokenizer::nextToken_abi_cxx11_(&local_88,&local_68);
      _Var2 = std::operator==(&local_88,&this->sectionName_);
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::__cxx11::string::~string((string *)&sStack_a8);
  }
  StringTokenizer::~StringTokenizer(&local_68);
  return _Var2;
}

Assistant:

bool SectionParser::isEndSection(const std::string& line) {
    StringTokenizer tokenizer(line);

    if (tokenizer.countTokens() >= 2) {
      std::string keyword = tokenizer.nextToken();

      if (keyword != "end") { return false; }

      std::string section = tokenizer.nextToken();
      if (section == sectionName_) {
        return true;
      } else {
        return false;
      }

    } else {
      return false;
    }
  }